

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O2

void free_okt(IFF_CHUNKED *mod)

{
  long lVar1;
  ulong uVar2;
  
  if (mod != (IFF_CHUNKED *)0x0) {
    if (mod->chunks != (IFF_CHUNK *)0x0) {
      lVar1 = 8;
      for (uVar2 = 0; uVar2 < mod->chunk_count; uVar2 = uVar2 + 1) {
        free(*(void **)((long)&mod->chunks->type + lVar1));
        lVar1 = lVar1 + 0x18;
      }
      free(mod->chunks);
    }
    free(mod);
    return;
  }
  return;
}

Assistant:

void free_okt(IFF_CHUNKED * mod)
{
	unsigned i;
	if (mod)
	{
		if (mod->chunks)
		{
			for (i = 0; i < mod->chunk_count; i++)
			{
				if (mod->chunks[i].data) free(mod->chunks[i].data);
			}
			free(mod->chunks);
		}
		free(mod);
	}
}